

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_chatwindow.h
# Opt level: O3

void __thiscall Ui_ChatWindow::setupUi(Ui_ChatWindow *this,QWidget *ChatWindow)

{
  QGridLayout *this_00;
  QPushButton *pQVar1;
  QListView *this_01;
  QLineEdit *this_02;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayData *local_38 [2];
  long local_28;
  
  QObject::objectName();
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  if (local_28 == 0) {
    QVar7.m_data = (storage_type *)0xa;
    QVar7.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar7);
    QObject::setObjectName((QString *)ChatWindow);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,8);
      }
    }
  }
  local_38[0] = (QArrayData *)&DAT_12c00000190;
  QWidget::resize((QSize *)ChatWindow);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,ChatWindow);
  this->gridLayout = this_00;
  QVar2.m_data = (storage_type *)0xa;
  QVar2.m_size = (qsizetype)local_38;
  QString::fromUtf8(QVar2);
  QObject::setObjectName((QString *)this_00);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  pQVar1 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar1,ChatWindow);
  this->connectButton = pQVar1;
  QVar3.m_data = (storage_type *)0xd;
  QVar3.m_size = (qsizetype)local_38;
  QString::fromUtf8(QVar3);
  QObject::setObjectName((QString *)pQVar1);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->connectButton,0,0,1,2,0);
  this_01 = (QListView *)operator_new(0x28);
  QListView::QListView(this_01,ChatWindow);
  this->chatView = this_01;
  QVar4.m_data = (storage_type *)0x8;
  QVar4.m_size = (qsizetype)local_38;
  QString::fromUtf8(QVar4);
  QObject::setObjectName((QString *)this_01);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  QWidget::setEnabled(SUB81(this->chatView,0));
  QAbstractItemView::setEditTriggers(this->chatView,0);
  QGridLayout::addWidget(this->gridLayout,this->chatView,1,0,1,2,0);
  this_02 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(this_02,ChatWindow);
  this->messageEdit = this_02;
  QVar5.m_data = (storage_type *)0xb;
  QVar5.m_size = (qsizetype)local_38;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_02);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  QWidget::setEnabled(SUB81(this->messageEdit,0));
  QGridLayout::addWidget(this->gridLayout,this->messageEdit,2,0,1,1,0);
  pQVar1 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar1,ChatWindow);
  this->sendButton = pQVar1;
  QVar6.m_data = (storage_type *)0xa;
  QVar6.m_size = (qsizetype)local_38;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar1);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  QWidget::setEnabled(SUB81(this->sendButton,0));
  QGridLayout::addWidget(this->gridLayout,this->sendButton,2,1,1,1,0);
  retranslateUi(this,ChatWindow);
  QPushButton::setDefault(SUB81(this->sendButton,0));
  QMetaObject::connectSlotsByName((QObject *)ChatWindow);
  return;
}

Assistant:

void setupUi(QWidget *ChatWindow)
    {
        if (ChatWindow->objectName().isEmpty())
            ChatWindow->setObjectName(QString::fromUtf8("ChatWindow"));
        ChatWindow->resize(400, 300);
        gridLayout = new QGridLayout(ChatWindow);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        connectButton = new QPushButton(ChatWindow);
        connectButton->setObjectName(QString::fromUtf8("connectButton"));

        gridLayout->addWidget(connectButton, 0, 0, 1, 2);

        chatView = new QListView(ChatWindow);
        chatView->setObjectName(QString::fromUtf8("chatView"));
        chatView->setEnabled(false);
        chatView->setEditTriggers(QAbstractItemView::NoEditTriggers);

        gridLayout->addWidget(chatView, 1, 0, 1, 2);

        messageEdit = new QLineEdit(ChatWindow);
        messageEdit->setObjectName(QString::fromUtf8("messageEdit"));
        messageEdit->setEnabled(false);

        gridLayout->addWidget(messageEdit, 2, 0, 1, 1);

        sendButton = new QPushButton(ChatWindow);
        sendButton->setObjectName(QString::fromUtf8("sendButton"));
        sendButton->setEnabled(false);

        gridLayout->addWidget(sendButton, 2, 1, 1, 1);


        retranslateUi(ChatWindow);

        sendButton->setDefault(true);


        QMetaObject::connectSlotsByName(ChatWindow);
    }